

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_set_from_euler_anglesf3(quaternion *self,float ax,float ay,float az)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  float az_local;
  float ay_local;
  float ax_local;
  quaternion *self_local;
  
  dVar1 = cos((double)(az / 2.0));
  dVar2 = cos((double)(ay / 2.0));
  dVar3 = cos((double)(ax / 2.0));
  dVar4 = sin((double)(az / 2.0));
  dVar5 = sin((double)(ay / 2.0));
  dVar6 = sin((double)(ax / 2.0));
  (self->field_0).q[3] =
       (float)dVar1 * (float)dVar2 * (float)dVar3 + (float)dVar4 * (float)dVar5 * (float)dVar6;
  dVar1 = cos((double)(az / 2.0));
  dVar2 = cos((double)(ay / 2.0));
  dVar3 = sin((double)(ax / 2.0));
  dVar4 = sin((double)(az / 2.0));
  dVar5 = sin((double)(ay / 2.0));
  dVar6 = cos((double)(ax / 2.0));
  (self->field_0).q[0] =
       (float)dVar1 * (float)dVar2 * (float)dVar3 + -((float)dVar4 * (float)dVar5 * (float)dVar6);
  dVar1 = cos((double)(az / 2.0));
  dVar2 = sin((double)(ay / 2.0));
  dVar3 = cos((double)(ax / 2.0));
  dVar4 = sin((double)(az / 2.0));
  dVar5 = cos((double)(ay / 2.0));
  dVar6 = sin((double)(ax / 2.0));
  (self->field_0).q[1] =
       (float)dVar1 * (float)dVar2 * (float)dVar3 + (float)dVar4 * (float)dVar5 * (float)dVar6;
  dVar1 = sin((double)(az / 2.0));
  dVar2 = cos((double)(ay / 2.0));
  dVar3 = cos((double)(ax / 2.0));
  dVar4 = cos((double)(az / 2.0));
  dVar5 = sin((double)(ay / 2.0));
  dVar6 = sin((double)(ax / 2.0));
  (self->field_0).q[2] =
       (float)dVar1 * (float)dVar2 * (float)dVar3 + -((float)dVar4 * (float)dVar5 * (float)dVar6);
  quaternion_normalize(self);
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_set_from_euler_anglesf3(struct quaternion *self, HYP_FLOAT ax, HYP_FLOAT ay, HYP_FLOAT az)
{
	self->w = HYP_COS(az / 2.0f) * HYP_COS(ay / 2.0f) * HYP_COS(ax / 2.0f) + HYP_SIN(az / 2.0f) * HYP_SIN(ay / 2.0f) * HYP_SIN(ax / 2.0f);
	self->x = HYP_COS(az / 2.0f) * HYP_COS(ay / 2.0f) * HYP_SIN(ax / 2.0f) - HYP_SIN(az / 2.0f) * HYP_SIN(ay / 2.0f) * HYP_COS(ax / 2.0f);
	self->y = HYP_COS(az / 2.0f) * HYP_SIN(ay / 2.0f) * HYP_COS(ax / 2.0f) + HYP_SIN(az / 2.0f) * HYP_COS(ay / 2.0f) * HYP_SIN(ax / 2.0f);
	self->z = HYP_SIN(az / 2.0f) * HYP_COS(ay / 2.0f) * HYP_COS(ax / 2.0f) - HYP_COS(az / 2.0f) * HYP_SIN(ay / 2.0f) * HYP_SIN(ax / 2.0f);

	quaternion_normalize(self);

	return self;
}